

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_states.cpp
# Opt level: O3

FState * __thiscall
FStateDefinitions::ResolveGotoLabel
          (FStateDefinitions *this,AActor *actor,PClassActor *mytype,char *name)

{
  int iVar1;
  undefined8 in_RAX;
  char *pcVar2;
  PClassActor *this_00;
  long lVar3;
  FState *pFVar4;
  PClassActor *pPVar5;
  char *classname;
  char *__s;
  bool bVar6;
  undefined8 uStack_38;
  
  uStack_38 = in_RAX;
  pcVar2 = strstr(name,"::");
  __s = name;
  this_00 = mytype;
  if (pcVar2 != (char *)0x0) {
    *pcVar2 = '\0';
    __s = pcVar2 + 2;
    iVar1 = strcasecmp(name,"Super");
    if (iVar1 == 0) {
      this_00 = dyn_cast<PClassActor>((DObject *)(mytype->super_PClass).ParentClass);
    }
    else {
      iVar1 = FName::NameManager::FindName(&FName::NameData,name,true);
      uStack_38 = CONCAT44(iVar1,(undefined4)uStack_38);
      this_00 = (PClassActor *)PClass::FindClass((FName *)((long)&uStack_38 + 4));
      if (this_00 == (PClassActor *)0x0) {
        I_Error("%s is an unknown class.",name);
      }
      pPVar5 = this_00;
      if (this_00 != (PClassActor *)AActor::RegistrationInfo.MyClass) {
        do {
          pPVar5 = (PClassActor *)(pPVar5->super_PClass).ParentClass;
          if (pPVar5 == (PClassActor *)AActor::RegistrationInfo.MyClass) break;
        } while (pPVar5 != (PClassActor *)0x0);
        if (pPVar5 == (PClassActor *)0x0) {
          I_Error("%s is not an actor class, so it has no states.",
                  FName::NameData.NameArray
                  [(this_00->super_PClass).super_PStruct.super_PNamedType.TypeName.Index].Text);
        }
      }
      bVar6 = mytype != (PClassActor *)0x0;
      pPVar5 = mytype;
      if (this_00 != mytype && bVar6) {
        do {
          pPVar5 = (PClassActor *)(pPVar5->super_PClass).ParentClass;
          bVar6 = pPVar5 != (PClassActor *)0x0;
          if (pPVar5 == this_00) break;
        } while (pPVar5 != (PClassActor *)0x0);
      }
      if (!bVar6) {
        I_Error("%s is not derived from %s so cannot access its states.",
                FName::NameData.NameArray
                [(mytype->super_PClass).super_PStruct.super_PNamedType.TypeName.Index].Text,
                FName::NameData.NameArray
                [(this_00->super_PClass).super_PStruct.super_PNamedType.TypeName.Index].Text);
      }
    }
  }
  pcVar2 = strchr(__s,0x2b);
  if (pcVar2 == (char *)0x0) {
    iVar1 = 0;
  }
  else {
    *pcVar2 = '\0';
    lVar3 = strtol(pcVar2 + 1,(char **)0x0,0);
    iVar1 = (int)lVar3;
  }
  if (this_00 == mytype) {
    pFVar4 = FindState(this,__s);
  }
  else {
    MakeStateNameList(__s);
    pFVar4 = PClassActor::FindState
                       (this_00,MakeStateNameList::namelist.Count,MakeStateNameList::namelist.Array,
                        true);
  }
  if (pFVar4 == (FState *)0x0) {
    if (iVar1 == 0) {
      pFVar4 = (FState *)0x0;
      Printf("\x1cGAttempt to get invalid state %s from actor %s.\n",__s,
             FName::NameData.NameArray
             [(this_00->super_PClass).super_PStruct.super_PNamedType.TypeName.Index].Text);
    }
    else {
      pFVar4 = (FState *)0x0;
      I_Error("Attempt to get invalid state %s from actor %s.",__s);
    }
  }
  else {
    pFVar4 = pFVar4 + iVar1;
  }
  if (name != (char *)0x0) {
    operator_delete__(name);
  }
  return pFVar4;
}

Assistant:

FState *FStateDefinitions::ResolveGotoLabel (AActor *actor, PClassActor *mytype, char *name)
{
	PClassActor *type = mytype;
	FState *state;
	char *namestart = name;
	char *label, *offset, *pt;
	int v;

	// Check for classname
	if ((pt = strstr (name, "::")) != NULL)
	{
		const char *classname = name;
		*pt = '\0';
		name = pt + 2;

		// The classname may either be "Super" to identify this class's immediate
		// superclass, or it may be the name of any class that this one derives from.
		if (stricmp (classname, "Super") == 0)
		{
			type = dyn_cast<PClassActor>(type->ParentClass);
			actor = GetDefaultByType(type);
		}
		else
		{
			// first check whether a state of the desired name exists
			PClass *stype = PClass::FindClass (classname);
			if (stype == NULL)
			{
				I_Error ("%s is an unknown class.", classname);
			}
			if (!stype->IsDescendantOf (RUNTIME_CLASS(AActor)))
			{
				I_Error ("%s is not an actor class, so it has no states.", stype->TypeName.GetChars());
			}
			if (!stype->IsAncestorOf (type))
			{
				I_Error ("%s is not derived from %s so cannot access its states.",
					type->TypeName.GetChars(), stype->TypeName.GetChars());
			}
			if (type != stype)
			{
				type = static_cast<PClassActor *>(stype);
				actor = GetDefaultByType (type);
			}
		}
	}
	label = name;
	// Check for offset
	offset = NULL;
	if ((pt = strchr (name, '+')) != NULL)
	{
		*pt = '\0';
		offset = pt + 1;
	}
	v = offset ? strtol (offset, NULL, 0) : 0;

	// Get the state's address.
	if (type == mytype)
	{
		state = FindState (label);
	}
	else
	{
		state = type->FindStateByString(label, true);
	}

	if (state != NULL)
	{
		state += v;
	}
	else if (v != 0)
	{
		I_Error ("Attempt to get invalid state %s from actor %s.", label, type->TypeName.GetChars());
	}
	else
	{
		Printf (TEXTCOLOR_RED "Attempt to get invalid state %s from actor %s.\n", label, type->TypeName.GetChars());
	}
	delete[] namestart;		// free the allocated string buffer
	return state;
}